

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O2

void ddb_ap(long ndims,double *qedims,Integer *ardims,Integer *pedims,long npes,long npdivs,
           long *pdivs)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  long local_70;
  
  lVar1 = ndims + -1;
  lVar8 = 0;
  lVar6 = 0;
  lVar7 = npdivs;
  if (0 < lVar1) {
    lVar6 = lVar1;
    lVar7 = npdivs;
  }
  while (local_70 = lVar7, lVar8 != lVar6) {
    lVar4 = dd_lk(pdivs,local_70,qedims[lVar8]);
    lVar3 = pdivs[lVar4];
    pedims[lVar8] = lVar3;
    npes = npes / lVar3;
    if (npes < 2) {
      npes = 1;
    }
    lVar7 = local_70;
    if (lVar8 < ndims + -2) {
      dVar10 = (double)npes;
      lVar2 = lVar8 + 1;
      lVar9 = lVar8 + 2;
      for (lVar5 = lVar9; ndims != lVar5; lVar5 = lVar5 + 1) {
        dVar10 = dVar10 / ((double)ardims[lVar5] / (double)ardims[lVar8 + 1]);
        qedims[lVar8 + 1] = dVar10;
      }
      dVar10 = pow(dVar10,1.0 / (double)(lVar1 - lVar8));
      qedims[lVar8 + 1] = dVar10;
      for (; ndims != lVar9; lVar9 = lVar9 + 1) {
        qedims[lVar9] = ((double)ardims[lVar9] / (double)ardims[lVar8 + 1]) * qedims[lVar8 + 1];
      }
      lVar8 = lVar2;
      if (1 < lVar3) {
        lVar7 = 1;
        while (lVar2 = lVar4 + 1, lVar2 < local_70) {
          lVar9 = lVar4 + 1;
          lVar4 = lVar2;
          if (pdivs[lVar9] % lVar3 == 0) {
            pdivs[lVar7] = pdivs[lVar9] / lVar3;
            lVar7 = lVar7 + 1;
          }
        }
      }
    }
    else {
      lVar8 = lVar8 + 1;
    }
  }
  pedims[ndims + -1] = npes;
  return;
}

Assistant:

void ddb_ap(long ndims, double * qedims, Integer * ardims, Integer * pedims,
                  long npes, long npdivs, long * pdivs)
      {
      long bq;
      long i, k, g;
      long idim;
         for(idim=0;idim<ndims-1;idim++){
            g = dd_lk(pdivs,npdivs,qedims[idim]);
            bq = pdivs[g] ;
            pedims[idim] = bq;
            npes /= bq;
            npes = (npes<1) ? 1 : npes;
            if(idim<ndims-2){
               qedims[idim+1] = (double) npes;
               for(i=idim+2;i<ndims;i++) qedims[idim+1] /=
                   (ardims[i]/(double)ardims[idim+1]);
               qedims[idim+1] = (double) pow(qedims[idim+1],
                   1.0/(double)(ndims-1-idim));
               for(i=idim+2;i<ndims;i++){
                   qedims[i] = (ardims[i]/(double)ardims[idim+1])*
                       qedims[idim+1];
               }

               if(bq>1) {
                   for(k=1,i=g+1;i<npdivs;i++){
                       if(pdivs[i]%bq==0) {
                           pdivs[k] = pdivs[i]/bq;
                           k += 1;
                       }
                   }
                   npdivs = k;
               }
            }
         }
         pedims[ndims-1] = npes;
      }